

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void set_ext_params_cam(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  long lVar2;
  
  pdVar1 = p->ext_params;
  lVar2 = (long)(p->info->ext_params).n;
  p->cam_alpha = pdVar1[lVar2 + -3];
  p->cam_beta = pdVar1[lVar2 + -2];
  p->cam_omega = pdVar1[lVar2 + -1];
  return;
}

Assistant:

void
set_ext_params_cam(xc_func_type *p, const double *ext_params)
{
  int nparams;
  assert(p != NULL);
  nparams = p->info->ext_params.n - 3;

  p->cam_alpha = get_ext_param(p, ext_params, nparams);
  p->cam_beta = get_ext_param(p, ext_params, nparams + 1);
  p->cam_omega = get_ext_param(p, ext_params, nparams + 2);
}